

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktDrawCreateInfoUtil.cpp
# Opt level: O2

void __thiscall
vkt::Draw::PipelineCreateInfo::ColorBlendState::ColorBlendState
          (ColorBlendState *this,VkPipelineColorBlendStateCreateInfo *createInfo)

{
  pointer pVVar1;
  VkBool32 VVar2;
  allocator_type local_11;
  
  std::
  vector<vk::VkPipelineColorBlendAttachmentState,std::allocator<vk::VkPipelineColorBlendAttachmentState>>
  ::vector<vk::VkPipelineColorBlendAttachmentState_const*,void>
            ((vector<vk::VkPipelineColorBlendAttachmentState,std::allocator<vk::VkPipelineColorBlendAttachmentState>>
              *)&this->m_attachments,createInfo->pAttachments,
             createInfo->pAttachments + createInfo->attachmentCount,&local_11);
  (this->super_VkPipelineColorBlendStateCreateInfo).sType = createInfo->sType;
  (this->super_VkPipelineColorBlendStateCreateInfo).pNext = createInfo->pNext;
  VVar2 = createInfo->logicOpEnable;
  (this->super_VkPipelineColorBlendStateCreateInfo).flags = createInfo->flags;
  (this->super_VkPipelineColorBlendStateCreateInfo).logicOpEnable = VVar2;
  (this->super_VkPipelineColorBlendStateCreateInfo).logicOp = createInfo->logicOp;
  pVVar1 = (this->m_attachments).
           super__Vector_base<vk::VkPipelineColorBlendAttachmentState,_std::allocator<vk::VkPipelineColorBlendAttachmentState>_>
           ._M_impl.super__Vector_impl_data._M_start;
  (this->super_VkPipelineColorBlendStateCreateInfo).attachmentCount =
       (deUint32)
       ((ulong)((long)(this->m_attachments).
                      super__Vector_base<vk::VkPipelineColorBlendAttachmentState,_std::allocator<vk::VkPipelineColorBlendAttachmentState>_>
                      ._M_impl.super__Vector_impl_data._M_finish - (long)pVVar1) >> 5);
  (this->super_VkPipelineColorBlendStateCreateInfo).pAttachments = pVVar1;
  return;
}

Assistant:

PipelineCreateInfo::ColorBlendState::ColorBlendState (const vk::VkPipelineColorBlendStateCreateInfo& createInfo)
	: m_attachments (createInfo.pAttachments, createInfo.pAttachments + createInfo.attachmentCount)
{
	sType = createInfo.sType;
	pNext = createInfo.pNext;
	flags					= createInfo.flags;
	logicOpEnable			= createInfo.logicOpEnable;
	logicOp					= createInfo.logicOp;
	attachmentCount			= static_cast<deUint32>(m_attachments.size());
	pAttachments			= &m_attachments[0];
}